

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O3

void plot_vis(t_gobj *z,_glist *glist,t_word *data,t_template *template,t_float basex,t_float basey,
             int tovis)

{
  double dVar1;
  _fielddesc *p_Var2;
  undefined1 auVar3 [16];
  t_template *ptVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _glist *p_Var7;
  _glist *extraout_RAX;
  _glist *p_Var8;
  _glist *extraout_RAX_00;
  _glist *extraout_RAX_01;
  _glist *extraout_RAX_02;
  _glist *extraout_RAX_03;
  _glist *extraout_RAX_04;
  _parentwidgetbehavior *p_Var9;
  uint uVar10;
  uint uVar11;
  int i;
  int iVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  _glist *p_Var17;
  ulong uVar18;
  t_word *ptVar19;
  char *pcVar20;
  t_gobj *ptVar21;
  t_float tVar22;
  float fVar23;
  t_float tVar24;
  float fVar25;
  float fVar26;
  t_float yloc;
  float local_4218;
  int elemsize;
  undefined8 local_4210;
  _fielddesc *local_4208;
  ulong local_4200;
  undefined1 local_41f8 [8];
  undefined8 uStack_41f0;
  t_word *local_41e0;
  _glist *local_41d8;
  float local_41d0;
  t_float xinc;
  _fielddesc *local_41c8;
  _glist *local_41c0;
  t_template *local_41b8;
  t_float xloc;
  t_float linewidth;
  char *local_41a8;
  ulong local_41a0;
  int local_4194;
  _glist *local_4190;
  undefined8 local_4188;
  t_float tStack_4180;
  t_float tStack_417c;
  double local_4178;
  t_float scalarvis;
  ulong local_4168;
  t_float vis;
  t_float style;
  int xonset;
  int wonset;
  int yonset;
  undefined1 local_4148 [16];
  t_template *elemtemplate;
  _glist *elemtemplatecanvas;
  char *tags [3];
  _fielddesc *wfielddesc;
  _fielddesc *yfielddesc;
  _fielddesc *xfielddesc;
  _array *array;
  t_symbol *elemtemplatesym;
  t_float edit;
  char tag0 [80];
  char tag [80];
  t_word coordinates [2048];
  
  local_41d8 = (_glist *)CONCAT44(local_41d8._4_4_,basex);
  tags[0] = tag;
  tags[1] = tag0;
  tags[2] = "array";
  uStack_41f0 = local_41f8;
  local_41f8 = (undefined1  [8])z;
  local_41e0 = data;
  local_41b8 = template;
  local_4194 = tovis;
  local_4190 = glist;
  iVar5 = plot_readownertemplate
                    ((t_plot *)z,data,template,&elemtemplatesym,&array,&linewidth,&xloc,&xinc,&yloc,
                     &style,&vis,&scalarvis,&edit,&xfielddesc,&yfielddesc,&wfielddesc);
  if (iVar5 != 0) {
    return;
  }
  if (((local_4194 != 0) && (vis == 0.0)) && (!NAN(vis))) {
    return;
  }
  iVar5 = array_getfields(elemtemplatesym,&elemtemplatecanvas,&elemtemplate,&elemsize,xfielddesc,
                          yfielddesc,wfielddesc,&xonset,&yonset,&wonset);
  ptVar19 = local_41e0;
  if (iVar5 != 0) {
    return;
  }
  local_4208 = wfielddesc;
  uVar11 = array->a_n;
  uVar14 = (ulong)uVar11;
  pcVar20 = array->a_vec;
  sprintf(tag,"plot%lx",local_41e0);
  uVar18 = (ulong)(uint)wonset;
  local_4200 = (ulong)(uint)xonset;
  p_Var17 = (_glist *)(ulong)(uint)yonset;
  local_41a8 = pcVar20;
  iVar5 = sprintf(tag0,"plot%lx_array%lx_onset%+d%+d%+d",ptVar19,pcVar20,uVar18,local_4200,p_Var17);
  p_Var7 = local_4190;
  p_Var8 = (_glist *)CONCAT44(extraout_var,iVar5);
  if ((local_4190->field_0xe9 & 1) != 0) {
    iVar5 = glist_getzoom(local_4190);
    p_Var8 = (_glist *)CONCAT44(extraout_var_00,iVar5);
    linewidth = (float)iVar5 * linewidth;
  }
  local_41a0 = uVar14;
  if (local_4194 == 0) {
    if (((scalarvis != 0.0) || (NAN(scalarvis))) && (0 < (int)uVar11)) {
      p_Var8 = (_glist *)(long)elemsize;
      uVar14 = 0;
      local_41d8 = p_Var8;
      do {
        ptVar21 = elemtemplatecanvas->gl_list;
        if (ptVar21 != (t_gobj *)0x0) {
          pcVar20 = local_41a8 + uVar14 * (long)local_41d8;
          do {
            p_Var8 = (_glist *)pd_getparentwidget(&ptVar21->g_pd);
            if (p_Var8 != (_glist *)0x0) {
              p_Var8 = (_glist *)
                       (*(code *)(p_Var8->gl_obj).te_inlet)
                                 (0,0,ptVar21,p_Var7,pcVar20,elemtemplate,0);
            }
            ptVar21 = ptVar21->g_next;
          } while (ptVar21 != (_gobj *)0x0);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != local_41a0);
    }
    p_Var7 = glist_getcanvas(p_Var8);
    pdgui_vmess((char *)0x0,"crs",p_Var7,"delete",tag);
    return;
  }
  local_4148._0_4_ = style;
  tVar22 = fielddesc_getfloat((_fielddesc *)((long)local_41f8 + 0x38),local_41b8,ptVar19,1);
  uVar16 = 0;
  if (0 < (int)tVar22) {
    uVar16 = (ulong)(uint)(int)tVar22;
  }
  uVar15 = (uint)(uVar16 * 0x66666667 >> 0x20);
  uVar6 = (uint)(uVar16 * 0x51eb851f >> 0x20) & 0x3fffffe0;
  if (0xfe < uVar6) {
    uVar6 = 0xff;
  }
  uVar10 = ((uVar15 >> 2) + (int)((uVar16 * 0x66666667) / 0x2800000000) * -10) * 0x20;
  if (0xfe < uVar10) {
    uVar10 = 0xff;
  }
  uVar15 = ((int)uVar16 + ((uVar15 >> 2) + (uVar15 >> 2)) * -5) * 0x20;
  if (0xfe < uVar15) {
    uVar15 = 0xff;
  }
  local_4168 = (ulong)(uVar15 | uVar6 << 0x10 | uVar10 << 8);
  local_41b8 = (t_template *)yfielddesc;
  local_41c8 = xfielddesc;
  local_41e0 = (t_word *)p_Var17;
  if (((float)local_4148._0_4_ == 0.0) && (!NAN((float)local_4148._0_4_))) {
    if (0 < (int)uVar11) {
      local_4218 = xloc + local_41d8._0_4_;
      local_4208 = (_fielddesc *)(double)local_4218;
      dVar1 = (double)xinc;
      lVar13 = (long)elemsize;
      local_41d0 = yloc;
      local_4188 = (char *)(ulong)(uVar11 - 1);
      local_4178 = (double)CONCAT44(local_4178._4_4_,linewidth);
      uVar18 = 0;
      fVar23 = -1e+20;
      fVar25 = 1e+20;
      local_4210 = (double)((ulong)local_4210._4_4_ << 0x20);
      pcVar20 = local_41a8;
      do {
        p_Var2 = local_41c8;
        local_41f8._0_4_ = fVar25;
        if ((int)local_4200 < 0) {
          fVar25 = (float)(double)local_4208;
          local_4208 = (_fielddesc *)((double)local_4208 + dVar1);
          tVar22 = fielddesc_cvttocoord(local_41c8,fVar25);
          tVar22 = glist_xtopixels(p_Var7,tVar22);
          uVar15 = (uint)tVar22;
          tVar22 = fielddesc_cvttocoord(p_Var2,(float)(double)local_4208);
          tVar22 = glist_xtopixels(p_Var7,tVar22);
          uVar11 = (uint)tVar22;
        }
        else {
          tVar22 = fielddesc_cvttocoord(local_41c8,*(float *)(pcVar20 + local_4200) + local_4218);
          tVar22 = glist_xtopixels(p_Var7,tVar22);
          uVar15 = (uint)tVar22;
          uVar11 = uVar15 + 2;
        }
        auVar3 = _local_41f8;
        local_41f8._4_4_ = 0;
        local_41f8._0_4_ = uVar11;
        uVar14 = (ulong)local_41f8;
        fVar26 = 0.0;
        if (-1 < (int)local_41e0) {
          fVar26 = *(float *)(pcVar20 + (long)local_41e0) + local_41d0;
        }
        if (1e+20 <= ABS(fVar26)) {
          fVar26 = 0.0;
        }
        local_41f8._0_4_ = auVar3._0_4_;
        fVar25 = fVar26;
        if ((float)local_41f8._0_4_ <= fVar26) {
          fVar25 = (float)local_41f8._0_4_;
        }
        if (fVar26 <= fVar23) {
          fVar26 = fVar23;
        }
        fVar23 = fVar26;
        if ((local_4188 == (char *)uVar18) || (_local_41f8 = auVar3, uVar11 != uVar15)) {
          uStack_41f0 = auVar3._8_8_;
          _local_41f8 = CONCAT88(uStack_41f0,uVar14);
          local_4148 = ZEXT416((uint)fVar23);
          local_41c0 = glist_getcanvas((_glist *)local_41e0);
          ptVar4 = local_41b8;
          tVar22 = fielddesc_cvttocoord((_fielddesc *)local_41b8,fVar25);
          tVar22 = glist_ytopixels(p_Var7,tVar22 + basey);
          tVar24 = fielddesc_cvttocoord((_fielddesc *)ptVar4,(t_float)local_4148._0_4_);
          tVar24 = glist_ytopixels(p_Var7,tVar24 + basey);
          pdgui_vmess((char *)0x0,"crr iiii rk rf rS",0,local_41c0,"create","rectangle",
                      (ulong)uVar15,(ulong)(uint)(int)tVar22,local_41f8,
                      (ulong)(uint)(int)(tVar24 + local_4178._0_4_),"-fill",local_4168,"-width",
                      "-tags",3,tags);
          uVar14 = local_41a0;
          if (1999 < (int)(float)local_4210) break;
          local_4210 = (double)CONCAT44(local_4210._4_4_,(int)(float)local_4210 + 1);
          fVar25 = 1e+20;
          fVar23 = -1e+20;
        }
        uVar18 = uVar18 + 1;
        pcVar20 = pcVar20 + lVar13;
        uVar14 = local_41a0;
      } while (local_41a0 != uVar18);
    }
    goto LAB_00159eee;
  }
  if (wonset < 0) {
    local_4218 = linewidth;
    if ((linewidth <= 0.0) || ((int)uVar11 < 1)) goto LAB_00159eee;
    local_4188 = (char *)CONCAT44(local_4188._4_4_,xloc);
    local_4208 = (_fielddesc *)(double)xloc;
    local_41c0 = (_glist *)(double)xinc;
    lVar13 = (long)elemsize;
    local_4210 = (double)CONCAT44(local_4210._4_4_,yloc + basey);
    uVar11 = 0;
    pcVar20 = local_41a8;
    iVar5 = -1;
    do {
      if ((int)local_4200 < 0) {
        tVar22 = (t_float)(double)local_4208;
        local_4208 = (_fielddesc *)((double)local_4208 + (double)local_41c0);
      }
      else {
        tVar22 = *(float *)(pcVar20 + local_4200) + (float)local_4188;
      }
      fVar25 = 0.0;
      if (-1 < (int)local_41e0) {
        fVar25 = *(float *)(pcVar20 + (long)local_41e0);
      }
      if (1e+20 <= ABS(fVar25)) {
        fVar25 = 0.0;
      }
      _local_41f8 = ZEXT416((uint)fVar25);
      tVar22 = fielddesc_cvttocoord(local_41c8,tVar22);
      tVar22 = glist_xtopixels(p_Var7,tVar22 + local_41d8._0_4_);
      iVar12 = (int)(tVar22 + 0.5);
      if ((-1 < (int)local_4200) || (p_Var8 = extraout_RAX_01, iVar5 != iVar12)) {
        coordinates[(int)(uVar11 * 2)].w_float = (float)iVar12;
        tVar22 = fielddesc_cvttocoord((_fielddesc *)local_41b8,(t_float)local_41f8._0_4_);
        tVar22 = glist_ytopixels(p_Var7,tVar22 + (float)local_4210);
        p_Var8 = (_glist *)(long)(int)(uVar11 * 2 + 1);
        coordinates[(long)p_Var8].w_float = tVar22;
        uVar11 = uVar11 + 1;
      }
      if ((uVar11 & 0x7ffffc00) != 0) goto LAB_00159c39;
      pcVar20 = pcVar20 + lVar13;
      uVar14 = uVar14 - 1;
      iVar5 = iVar12;
    } while (uVar14 != 0);
    uVar14 = local_41a0;
    if (uVar11 == 0) goto LAB_00159eee;
    if (uVar11 == 1) {
      coordinates[2]._0_4_ = (undefined4)(iVar12 + 10);
      fVar25 = yloc + basey;
      tVar22 = fielddesc_cvttocoord((_fielddesc *)local_41b8,(t_float)local_41f8._0_4_);
      coordinates[3]._0_4_ = glist_ytopixels(p_Var7,tVar22 + fVar25);
      uVar11 = 2;
      p_Var8 = extraout_RAX_02;
    }
LAB_00159c39:
    p_Var8 = glist_getcanvas(p_Var8);
    p_Var7 = local_4190;
    pdgui_vmess((char *)0x0,"crr iiii rf rk ri rS",SUB84((double)local_4218,0),p_Var8,"create",
                "line",0,0,0,0,"-width","-fill",local_4168,"-smooth",
                (ulong)(-(uint)((float)local_4148._0_4_ == 2.0) & 1),"-tags",3,tags);
    p_Var8 = extraout_RAX_03;
  }
  else {
    if ((int)uVar11 < 1) {
      uVar15 = 0;
      tVar22 = 0.0;
      uVar6 = 0;
      uVar10 = 0;
      iVar5 = 0;
      uVar11 = 0;
LAB_00159ce7:
      ptVar4 = local_41b8;
      local_41f8._4_4_ = tVar22;
      local_41f8._0_4_ = uVar15;
      uStack_41f0._0_4_ = uVar6;
      uStack_41f0._4_4_ = uVar10;
      local_41c8 = (_fielddesc *)CONCAT44(local_41c8._4_4_,(float)(iVar5 + 10));
      coordinates[(int)(uVar11 * 2)].w_float = (float)(iVar5 + 10);
      fVar25 = yloc + basey;
      local_4188 = (char *)CONCAT44(tVar22,tVar22);
      tStack_4180 = tVar22;
      tStack_417c = tVar22;
      tVar22 = fielddesc_cvttocoord((_fielddesc *)local_41b8,tVar22);
      p_Var2 = local_4208;
      local_4210 = (double)CONCAT44(local_4210._4_4_,tVar22 + fVar25);
      tVar22 = fielddesc_cvttocoord(local_4208,(t_float)local_41f8._0_4_);
      tVar22 = glist_ytopixels(p_Var7,(float)local_4210 - tVar22);
      coordinates[(int)(uVar11 * 2 + 1)].w_float = tVar22;
      coordinates[(int)(uVar11 * 2 + 2)].w_index = (int)local_41c8;
      tVar22 = fielddesc_cvttocoord((_fielddesc *)ptVar4,(float)local_4188);
      tVar24 = fielddesc_cvttocoord(p_Var2,(t_float)local_41f8._0_4_);
      tVar22 = glist_ytopixels(p_Var7,tVar24 + tVar22 + fVar25);
      p_Var8 = (_glist *)(long)(int)(uVar11 * 2 + 3);
      coordinates[(long)p_Var8].w_float = tVar22;
      uVar11 = uVar11 + 2;
    }
    else {
      local_4218 = xloc;
      local_4188 = (char *)(double)xloc;
      local_4178 = (double)xinc;
      local_4210 = (double)(long)elemsize;
      local_41d0 = yloc + basey;
      uVar11 = 0;
      pcVar20 = local_41a8;
      iVar12 = -1;
      do {
        if ((int)local_4200 < 0) {
          tVar22 = (t_float)(double)local_4188;
          local_4188 = (char *)((double)local_4188 + local_4178);
        }
        else {
          tVar22 = *(float *)(pcVar20 + local_4200) + local_4218;
        }
        if ((int)local_41e0 < 0) {
          local_41f8._4_4_ = 0;
        }
        else {
          local_41f8._4_4_ = *(undefined4 *)(pcVar20 + (long)local_41e0);
        }
        local_41f8._0_4_ = *(undefined4 *)(pcVar20 + uVar18);
        uStack_41f0 = 0;
        tVar22 = fielddesc_cvttocoord(local_41c8,tVar22);
        tVar24 = glist_xtopixels(p_Var7,tVar22 + local_41d8._0_4_);
        uVar6 = (uint)-(ulong)(ABS((float)local_41f8._4_4_) < 1e+20);
        uVar15 = -(uint)(ABS((float)local_41f8._0_4_) < 1e+20) & local_41f8._0_4_;
        tVar22 = (t_float)(uVar6 & local_41f8._4_4_);
        uVar6 = uVar6 & (uint)uStack_41f0;
        uVar10 = (uint)(-(ulong)(ABS((float)local_41f8._4_4_) < 1e+20) >> 0x20) & uStack_41f0._4_4_;
        iVar5 = (int)(tVar24 + 0.5);
        if ((-1 < (int)local_4200) || (p_Var8 = extraout_RAX, iVar12 != iVar5)) {
          coordinates[(int)(uVar11 * 2)].w_float = (float)iVar5;
          local_41f8._4_4_ = tVar22;
          local_41f8._0_4_ = uVar15;
          uStack_41f0._0_4_ = uVar6;
          uStack_41f0._4_4_ = uVar10;
          tVar22 = fielddesc_cvttocoord((_fielddesc *)local_41b8,tVar22);
          local_41c0 = (_glist *)CONCAT44(local_41c0._4_4_,tVar22 + local_41d0);
          tVar22 = fielddesc_cvttocoord(local_4208,(t_float)local_41f8._0_4_);
          tVar22 = glist_ytopixels(p_Var7,local_41c0._0_4_ - tVar22);
          p_Var8 = (_glist *)(long)(int)(uVar11 * 2 + 1);
          coordinates[(long)p_Var8].w_float = tVar22;
          uVar11 = uVar11 + 1;
          uVar15 = local_41f8._0_4_;
          tVar22 = (t_float)local_41f8._4_4_;
          uVar6 = (uint)uStack_41f0;
          uVar10 = uStack_41f0._4_4_;
        }
        if ((uVar11 & 0x7ffffc00) != 0) goto LAB_00159def;
        pcVar20 = pcVar20 + (long)local_4210;
        uVar14 = uVar14 - 1;
        iVar12 = iVar5;
      } while (uVar14 != 0);
      if (0 < (int)local_41a0) {
        local_4178 = (double)xinc;
        local_41d0 = yloc + basey;
        uVar14 = local_41a0 + 1;
        pcVar20 = local_41a8 + (local_41a0 - 1) * (long)elemsize;
        local_4210 = (double)-(long)elemsize;
        iVar12 = -1;
        do {
          if ((int)local_4200 < 0) {
            local_4188 = (char *)((double)local_4188 - local_4178);
            tVar22 = (t_float)(double)local_4188;
          }
          else {
            tVar22 = *(float *)(pcVar20 + local_4200) + local_4218;
          }
          if ((int)local_41e0 < 0) {
            local_41f8._4_4_ = 0;
          }
          else {
            local_41f8._4_4_ = *(undefined4 *)(pcVar20 + (long)local_41e0);
          }
          local_41f8._0_4_ = *(undefined4 *)(pcVar20 + uVar18);
          uStack_41f0 = 0;
          tVar22 = fielddesc_cvttocoord(local_41c8,tVar22);
          tVar24 = glist_xtopixels(p_Var7,tVar22 + local_41d8._0_4_);
          uVar6 = (uint)-(ulong)(ABS((float)local_41f8._4_4_) < 1e+20);
          uVar15 = -(uint)(ABS((float)local_41f8._0_4_) < 1e+20) & local_41f8._0_4_;
          tVar22 = (t_float)(uVar6 & local_41f8._4_4_);
          uVar6 = uVar6 & (uint)uStack_41f0;
          uVar10 = (uint)(-(ulong)(ABS((float)local_41f8._4_4_) < 1e+20) >> 0x20) &
                   uStack_41f0._4_4_;
          iVar5 = (int)(tVar24 + 0.5);
          if ((-1 < (int)local_4200) || (p_Var8 = extraout_RAX_00, iVar12 != iVar5)) {
            coordinates[(int)(uVar11 * 2)].w_float = (float)iVar5;
            local_41f8._4_4_ = tVar22;
            local_41f8._0_4_ = uVar15;
            uStack_41f0._0_4_ = uVar6;
            uStack_41f0._4_4_ = uVar10;
            tVar22 = fielddesc_cvttocoord((_fielddesc *)local_41b8,tVar22);
            local_41c0 = (_glist *)CONCAT44(local_41c0._4_4_,tVar22 + local_41d0);
            tVar22 = fielddesc_cvttocoord(local_4208,(t_float)local_41f8._0_4_);
            tVar22 = glist_ytopixels(p_Var7,tVar22 + local_41c0._0_4_);
            p_Var8 = (_glist *)(long)(int)(uVar11 * 2 + 1);
            coordinates[(long)p_Var8].w_float = tVar22;
            uVar11 = uVar11 + 1;
            uVar15 = local_41f8._0_4_;
            tVar22 = (t_float)local_41f8._4_4_;
            uVar6 = (uint)uStack_41f0;
            uVar10 = uStack_41f0._4_4_;
          }
          if ((uVar11 & 0x7ffffc00) != 0) goto LAB_00159def;
          uVar14 = uVar14 - 1;
          pcVar20 = pcVar20 + (long)local_4210;
          iVar12 = iVar5;
        } while (1 < uVar14);
      }
      if ((int)uVar11 < 4) goto LAB_00159ce7;
    }
LAB_00159def:
    p_Var8 = glist_getcanvas(p_Var8);
    uVar14 = 1;
    if ((p_Var7->field_0xe9 & 1) != 0) {
      uVar15 = glist_getzoom(p_Var7);
      uVar14 = (ulong)uVar15;
    }
    p_Var7 = local_4190;
    pdgui_vmess((char *)0x0,"crr ri rk rk ri rS",p_Var8,"create","polygon","-width",uVar14,"-fill",
                local_4168,"-outline",local_4168,"-smooth",
                (ulong)(-(uint)((float)local_4148._0_4_ == 2.0) & 1),"-tags",3,tags);
    p_Var8 = extraout_RAX_04;
  }
  p_Var8 = glist_getcanvas(p_Var8);
  pdgui_vmess((char *)0x0,"crs w",p_Var8,"coords",tag0,(ulong)(uVar11 * 2),coordinates);
  uVar14 = local_41a0;
LAB_00159eee:
  if (((scalarvis != 0.0) || (NAN(scalarvis))) && (0 < (int)uVar14)) {
    local_41f8 = (undefined1  [8])local_41e0;
    local_41c8 = (_fielddesc *)(double)xloc;
    local_4210 = (double)local_41d8._0_4_;
    local_41c0 = (_glist *)(double)xinc;
    local_4208 = (_fielddesc *)CONCAT44(local_4208._4_4_,xloc + local_41d8._0_4_);
    lVar13 = (long)elemsize;
    local_4188 = local_41a8 + local_4200;
    local_41e0 = (t_word *)(local_41a8 + (long)(t_object *)local_41e0);
    uVar14 = 0;
    do {
      if ((int)local_4200 < 0) {
        fVar25 = (float)((double)local_41c8 + local_4210);
        local_41c8 = (_fielddesc *)((double)local_41c8 + (double)local_41c0);
      }
      else {
        fVar25 = *(float *)(local_4188 + uVar14 * lVar13) + local_4208._0_4_;
      }
      local_4190 = (_glist *)CONCAT44(local_4190._4_4_,fVar25);
      if ((int)local_41f8._0_4_ < 0) {
        tVar22 = 0.0;
      }
      else {
        tVar22 = *(t_float *)((long)local_41e0 + uVar14 * lVar13);
      }
      tVar22 = fielddesc_cvttocoord((_fielddesc *)local_41b8,tVar22);
      local_41d8 = (_glist *)CONCAT44(local_41d8._4_4_,tVar22);
      ptVar21 = elemtemplatecanvas->gl_list;
      if (ptVar21 != (t_gobj *)0x0) {
        local_41d8 = (_glist *)CONCAT44(local_41d8._4_4_,tVar22 + basey + yloc);
        ptVar19 = (t_word *)(local_41a8 + uVar14 * lVar13);
        do {
          p_Var9 = pd_getparentwidget(&ptVar21->g_pd);
          if (p_Var9 != (_parentwidgetbehavior *)0x0) {
            (*p_Var9->w_parentvisfn)
                      (ptVar21,p_Var7,ptVar19,elemtemplate,local_4190._0_4_,local_41d8._0_4_,
                       local_4194);
          }
          ptVar21 = ptVar21->g_next;
        } while (ptVar21 != (_gobj *)0x0);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != local_41a0);
  }
  return;
}

Assistant:

static void plot_vis(t_gobj *z, t_glist *glist,
    t_word *data, t_template *template, t_float basex, t_float basey,
    int tovis)
{
    t_plot *x = (t_plot *)z;
    int elemsize, yonset, wonset, xonset, i;
    t_canvas *elemtemplatecanvas;
    t_template *elemtemplate;
    t_symbol *elemtemplatesym;
    t_float linewidth, xloc, xinc, yloc, style, yval,
        vis, scalarvis, edit;
    double xsum;
    t_array *array;
    int nelem;
    char *elem;
    t_fielddesc *xfielddesc, *yfielddesc, *wfielddesc;
    char tag[80], tag0[80];
    const char*tags[] = {tag, tag0, "array"};
        /* even if the array is "invisible", if its visibility is
        set by an instance variable you have to explicitly erase it,
        because the flag could earlier have been on when we were getting
        drawn.  Rather than look to try to find out whether we're
        visible we just do the erasure.  At the TK level this should
        cause no action because the tag matches nobody.  LATER we
        might want to optimize this somehow.  Ditto the "vis()" routines
        for other drawing instructions. */

    if (plot_readownertemplate(x, data, template,
        &elemtemplatesym, &array, &linewidth, &xloc, &xinc, &yloc, &style,
        &vis, &scalarvis, &edit, &xfielddesc, &yfielddesc, &wfielddesc) ||
            ((vis == 0) && tovis) /* see above for 'tovis' */
            || array_getfields(elemtemplatesym, &elemtemplatecanvas,
                &elemtemplate, &elemsize, xfielddesc, yfielddesc, wfielddesc,
                &xonset, &yonset, &wonset))
                    return;
    nelem = array->a_n;
    elem = (char *)array->a_vec;

    sprintf(tag , "plot%lx", data);
        /* a tag that uniquely identifies the sub-plot */
    sprintf(tag0, "plot%lx_array%lx_onset%+d%+d%+d", data, elem, wonset, xonset, yonset);

    if (glist->gl_isgraph)
        linewidth *= glist_getzoom(glist);

    if (tovis)
    {
         /* we use t_word because pdgui_vmess() has a convenient FLOATWORDS type
          * FLOATARRAY is impractical (as it sends a list, and the GUI expects arguments)
          */
        t_word coordinates[1024*2];

        if (style == PLOTSTYLE_POINTS)
        {
            t_float minyval = 1e20, maxyval = -1e20;
            int ndrawn = 0;
            int color = numbertocolor(
                fielddesc_getfloat(&x->x_outlinecolor, template, data, 1));

            for (xsum = basex + xloc, i = 0; i < nelem; i++)
            {
                t_float yval, xpix, ypix, nextxloc, usexloc;
                int ixpix, inextx;

                if (xonset >= 0)
                {
                    usexloc = basex + xloc +
                        *(t_float *)((elem + elemsize * i) + xonset);
                    ixpix = glist_xtopixels(glist,
                        fielddesc_cvttocoord(xfielddesc, usexloc));
                    inextx = ixpix + 2;
                }
                else
                {
                    usexloc = xsum;
                    xsum += xinc;
                    ixpix = glist_xtopixels(glist,
                        fielddesc_cvttocoord(xfielddesc, usexloc));
                    inextx = glist_xtopixels(glist,
                        fielddesc_cvttocoord(xfielddesc, xsum));
                }

                if (yonset >= 0)
                    yval = yloc + *(t_float *)((elem + elemsize * i) + yonset);
                else yval = 0;
                yval = CLIP(yval);
                if (yval < minyval)
                    minyval = yval;
                if (yval > maxyval)
                    maxyval = yval;
                if (i == nelem-1 || inextx != ixpix)
                {

                    pdgui_vmess(0, "crr iiii rk rf rS",
                        glist_getcanvas(glist), "create", "rectangle",
                        ixpix , (int) glist_ytopixels(glist, basey + fielddesc_cvttocoord(yfielddesc, minyval)),
                        inextx, (int)(glist_ytopixels(glist, basey + fielddesc_cvttocoord(yfielddesc, maxyval)) + linewidth),
                        "-fill", color,
                        "-width", 0.,
                        "-tags", 3, tags);
                    ndrawn++;
                    minyval = 1e20;
                    maxyval = -1e20;
                }
                if (ndrawn > 2000) break;
            }
        }
        else
        {
            int outline = numbertocolor(
                fielddesc_getfloat(&x->x_outlinecolor, template, data, 1));
            int lastpixel = -1, ndrawn = 0;
            t_float yval = 0, wval = 0, xpix;
            int ixpix = 0;
                /* draw the trace */


            if (wonset >= 0)
            {
                    /* found "w" field which controls linewidth.  The trace is
                    a filled polygon with 2n points. */
                for (i = 0, xsum = xloc; i < nelem; i++)
                {
                    t_float usexloc;
                    if (xonset >= 0)
                        usexloc = xloc + *(t_float *)((elem + elemsize * i)
                            + xonset);
                    else usexloc = xsum, xsum += xinc;
                    if (yonset >= 0)
                        yval = *(t_float *)((elem + elemsize * i) + yonset);
                    else yval = 0;
                    yval = CLIP(yval);
                    wval = *(t_float *)((elem + elemsize * i) + wonset);
                    wval = CLIP(wval);
                    xpix = glist_xtopixels(glist,
                        basex + fielddesc_cvttocoord(xfielddesc, usexloc));
                    ixpix = xpix + 0.5;
                    if (xonset >= 0 || ixpix != lastpixel)
                    {
                        coordinates[ndrawn*2+0].w_float = ixpix;
                        coordinates[ndrawn*2+1].w_float = glist_ytopixels(
                            glist,
                            basey
                            + yloc
                            + fielddesc_cvttocoord(yfielddesc, yval)
                            - fielddesc_cvttocoord(wfielddesc, wval));
                        ndrawn++;
                    }
                    lastpixel = ixpix;
                    if (ndrawn*2 >= sizeof(coordinates)/sizeof(*coordinates))
                        goto ouch;
                }
                lastpixel = -1;
                for (i = nelem-1; i >= 0; i--)
                {
                    t_float usexloc;
                    if (xonset >= 0)
                        usexloc = xloc + *(t_float *)((elem + elemsize * i)
                            + xonset);
                    else xsum -= xinc, usexloc = xsum;
                    if (yonset >= 0)
                        yval = *(t_float *)((elem + elemsize * i) + yonset);
                    else yval = 0;
                    yval = CLIP(yval);
                    wval = *(t_float *)((elem + elemsize * i) + wonset);
                    wval = CLIP(wval);
                    xpix = glist_xtopixels(glist,
                        basex + fielddesc_cvttocoord(xfielddesc, usexloc));
                    ixpix = xpix + 0.5;
                    if (xonset >= 0 || ixpix != lastpixel)
                    {
                        coordinates[ndrawn*2+0].w_float = ixpix;
                        coordinates[ndrawn*2+1].w_float = glist_ytopixels(
                            glist,
                            basey
                            + yloc
                            + fielddesc_cvttocoord(yfielddesc, yval)
                            + fielddesc_cvttocoord(wfielddesc, wval));
                        ndrawn++;
                    }
                    lastpixel = ixpix;
                    if (ndrawn*2 >= sizeof(coordinates)/sizeof(*coordinates))
                        goto ouch;
                }

                    /* TK will complain if there aren't at least 3 points.
                    There should be at least two already. */
                if (ndrawn < 4)
                {
                    coordinates[ndrawn*2+0].w_float = ixpix + 10;
                    coordinates[ndrawn*2+1].w_float = glist_ytopixels(
                        glist,
                        basey
                        + yloc
                        + fielddesc_cvttocoord(yfielddesc, yval)
                        - fielddesc_cvttocoord(wfielddesc, wval));
                    ndrawn++;

                    coordinates[ndrawn*2+0].w_float = ixpix + 10;
                    coordinates[ndrawn*2+1].w_float = glist_ytopixels(
                        glist,
                        basey
                        + yloc
                        + fielddesc_cvttocoord(yfielddesc, yval)
                        + fielddesc_cvttocoord(wfielddesc, wval));
                    ndrawn++;
                }
            ouch:

                pdgui_vmess(0, "crr ri rk rk ri rS",
                    glist_getcanvas(glist), "create", "polygon",
                    "-width", (glist->gl_isgraph ? glist_getzoom(glist) : 1),
                    "-fill", outline,
                    "-outline", outline,
                    "-smooth", (style == PLOTSTYLE_BEZ),
                    "-tags", 3, tags);

                pdgui_vmess(0, "crs w",
                    glist_getcanvas(glist), "coords", tag0,
                    ndrawn*2, coordinates);
            }
            else if (linewidth > 0)
            {
                    /* no "w" field.  If the linewidth is positive, draw a
                    segmented line with the requested width; otherwise don't
                    draw the trace at all. */
                for (i = 0, xsum = xloc; i < nelem; i++)
                {
                    t_float usexloc;
                    if (xonset >= 0)
                        usexloc = xloc + *(t_float *)((elem + elemsize * i)
                            + xonset);
                    else usexloc = xsum, xsum += xinc;
                    if (yonset >= 0)
                        yval = *(t_float *)((elem + elemsize * i) + yonset);
                    else yval = 0;
                    yval = CLIP(yval);


                    xpix = glist_xtopixels(glist,
                        basex + fielddesc_cvttocoord(xfielddesc, usexloc));
                    ixpix = xpix + 0.5;
                    if (xonset >= 0 || ixpix != lastpixel)
                    {
                        coordinates[ndrawn*2+0].w_float = ixpix;
                        coordinates[ndrawn*2+1].w_float = glist_ytopixels(
                            glist,
                            basey
                            + yloc
                            + fielddesc_cvttocoord(yfielddesc, yval));
                        ndrawn++;
                    }
                    lastpixel = ixpix;
                    if (ndrawn*2 >= sizeof(coordinates)/sizeof(*coordinates)) break;
                }

                    /* TK will complain if there aren't at least 2 points... */
                if (ndrawn == 1)
                {
                    coordinates[2].w_float = ixpix + 10;
                    coordinates[3].w_float = glist_ytopixels(glist, basey + yloc + fielddesc_cvttocoord(yfielddesc, yval));
                    ndrawn = 2;
                }

                if(ndrawn)
                {
                    pdgui_vmess(0, "crr iiii rf rk ri rS",
                        glist_getcanvas(glist), "create", "line",
                        0, 0, 0, 0,
                        "-width", linewidth,
                        "-fill", outline,
                        "-smooth", (style == PLOTSTYLE_BEZ),
                        "-tags", 3, tags);
                    pdgui_vmess(0, "crs w",
                        glist_getcanvas(glist), "coords", tag0,
                        ndrawn*2, coordinates);
                }
            }
        }
            /* We're done with the outline; now draw all the points.
            This code is inefficient since the template has to be
            searched for drawing instructions for every last point. */
        if (scalarvis != 0)
        {
            for (xsum = xloc, i = 0; i < nelem; i++)
            {
                t_float usexloc, useyloc;
                t_gobj *y;
                if (xonset >= 0)
                    usexloc = basex + xloc +
                        *(t_float *)((elem + elemsize * i) + xonset);
                else usexloc = basex + xsum, xsum += xinc;
                if (yonset >= 0)
                    yval = *(t_float *)((elem + elemsize * i) + yonset);
                else yval = 0;
                useyloc = basey + yloc +
                    fielddesc_cvttocoord(yfielddesc, yval);
                for (y = elemtemplatecanvas->gl_list; y; y = y->g_next)
                {
                    const t_parentwidgetbehavior *wb =
                        pd_getparentwidget(&y->g_pd);
                    if (!wb) continue;
                    (*wb->w_parentvisfn)(y, glist,
                        (t_word *)(elem + elemsize * i),
                            elemtemplate, usexloc, useyloc, tovis);
                }
            }
        }
    }
    else
    {
            /* un-draw the individual points */
        if (scalarvis != 0)
        {
            int i;
            for (i = 0; i < nelem; i++)
            {
                t_gobj *y;
                for (y = elemtemplatecanvas->gl_list; y; y = y->g_next)
                {
                    const t_parentwidgetbehavior *wb =
                        pd_getparentwidget(&y->g_pd);
                    if (!wb) continue;
                    (*wb->w_parentvisfn)(y, glist,
                        (t_word *)(elem + elemsize * i), elemtemplate,
                            0, 0, 0);
                }
            }
        }
            /* and then the trace */
        pdgui_vmess(0, "crs", glist_getcanvas(glist), "delete", tag);
    }
}